

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BranchAndBound.cpp
# Opt level: O1

bool __thiscall
tsbp::LeftmostActiveOnly::IsFixedSequence(LeftmostActiveOnly *this,Node *node,size_t nextItemId)

{
  size_type sVar1;
  int *piVar2;
  size_type sVar3;
  bool bVar4;
  initializer_list<unsigned_long> __l;
  vector<unsigned_long,_std::allocator<unsigned_long>_> fixedSequence;
  allocator_type local_c1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_c0;
  unsigned_long local_a8 [17];
  
  sVar1 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::count
                    (&((node->Packing)._M_t.
                       super___uniq_ptr_impl<tsbp::Packing2D,_std::default_delete<tsbp::Packing2D>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_tsbp::Packing2D_*,_std::default_delete<tsbp::Packing2D>_>
                       .super__Head_base<0UL,_tsbp::Packing2D_*,_false>._M_head_impl)->PlacedItems);
  memcpy(local_a8,&DAT_00161230,0x88);
  __l._M_len = 0x11;
  __l._M_array = local_a8;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_c0,__l,&local_c1);
  if (sVar1 != 0) {
    piVar2 = (int *)(*(long *)&(((node->Packing)._M_t.
                                 super___uniq_ptr_impl<tsbp::Packing2D,_std::default_delete<tsbp::Packing2D>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_tsbp::Packing2D_*,_std::default_delete<tsbp::Packing2D>_>
                                 .super__Head_base<0UL,_tsbp::Packing2D_*,_false>._M_head_impl)->
                               Items).
                               super__Vector_base<tsbp::Rectangle,_std::allocator<tsbp::Rectangle>_>
                               ._M_impl + 0x10);
    sVar3 = 0;
    do {
      if (local_c0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start[sVar3] != (long)*piVar2) {
        bVar4 = false;
        goto LAB_00147b4b;
      }
      sVar3 = sVar3 + 1;
      piVar2 = piVar2 + 8;
    } while (sVar1 != sVar3);
  }
  if (nextItemId == 0xffffffffffffffff) {
    bVar4 = true;
  }
  else {
    bVar4 = local_c0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start[sVar1] == nextItemId;
  }
LAB_00147b4b:
  if (local_c0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_c0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_c0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return bVar4;
}

Assistant:

bool LeftmostActiveOnly::IsFixedSequence(const Node& node, size_t nextItemId)
{
    const auto& packing = node.Packing;
    size_t currentItemId = node.ItemIdToPlace;

    size_t numberOfPlacedItems = node.PlacedItems().count();

    std::vector<size_t> fixedSequence = {0, 10, 5, 9, 14, 11, 2, 4, 7, 3, 6, 16, 12, 1, 15, 17, 13};

    const auto& placedItems = node.Packing->Items;
    for (size_t i = 0; i < numberOfPlacedItems; i++)
    {
        const Rectangle& placedItem = placedItems[i];

        size_t itemIdToPlace = fixedSequence[i];

        if (placedItem.InternId != itemIdToPlace)
        {
            return false;
        }
    }

    if (nextItemId == -1)
    {
        return true;
    }

    size_t nextItemIdToPlace = fixedSequence[numberOfPlacedItems];
    if (nextItemIdToPlace != nextItemId)
    {
        return false;
    }

    return true;
}